

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  unsigned_long *puVar5;
  rc_data *prVar6;
  ulong uVar7;
  rc_size rVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined8 in_XMM3_Qb;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  rVar8.r_size = 0;
  rVar8.c_size = 0;
  if (begin != end) {
    uVar9 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      puVar5 = (this->A).super_bit_array_impl.m_data._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        dVar14 = 0.0;
        dVar12 = 0.0;
      }
      else {
        auVar11 = ZEXT816(0);
        auVar13 = ZEXT816(0);
        do {
          uVar4 = *local_38._M_head_impl;
          uVar10 = uVar4 + 0x3f;
          if (-1 < (int)uVar4) {
            uVar10 = uVar4;
          }
          auVar15._0_8_ =
               (double)value_bit_array<-1,_1>::return_value
                       [(uint)(puVar5[(int)uVar10 >> 6] >> ((ulong)uVar4 & 0x3f)) & 1];
          auVar15._8_8_ = in_XMM3_Qb;
          puVar1 = (uint *)((long)local_38._M_head_impl + 4);
          local_38._M_head_impl = local_38._M_head_impl + 8;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (this->P)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl[(int)uVar4];
          auVar11 = vfmadd231sd_fma(auVar11,auVar15,auVar2);
          dVar12 = auVar11._0_8_;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (this->pi)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl[(int)*puVar1];
          auVar13 = vfmadd231sd_fma(auVar13,auVar15,auVar3);
          dVar14 = auVar13._0_8_;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      prVar6 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      prVar6[uVar9].id = (int)uVar9;
      dVar12 = ((this->c->linear_elements)._M_t.
                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl[begin->column] - dVar14) -
               dVar12;
      prVar6[uVar9].value = dVar12;
      uVar4 = begin->value;
      uVar10 = uVar4 + 0x3f;
      if (-1 < (int)uVar4) {
        uVar10 = uVar4;
      }
      uVar7 = puVar5[(int)uVar10 >> 6];
      prVar6[uVar9].f =
           value_bit_array<-1,_1>::return_value[(uint)(uVar7 >> ((ulong)uVar4 & 0x3f)) & 1];
      if ((uVar7 >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        auVar11._8_8_ = 0x8000000000000000;
        auVar11._0_8_ = 0x8000000000000000;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar12;
        auVar11 = vxorpd_avx512vl(auVar13,auVar11);
        rVar8.r_size = rVar8.r_size + 1;
        rVar8.c_size = 0;
        dVar12 = (double)vmovlpd_avx(auVar11);
        prVar6[uVar9].value = dVar12;
      }
      uVar9 = uVar9 + 1;
      begin = begin + 1;
    } while (begin != end);
    rVar8 = (rc_size)((long)rVar8 << 0x20 | uVar9 & 0xffffffff);
  }
  return rVar8;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }